

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O0

char * get_savestate_path(char *romfile,int number)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint in_ESI;
  char *savestate_path;
  int savestate_path_buf_size;
  char *rom_path;
  char buf [4096];
  char *in_stack_ffffffffffffefc8;
  char *in_stack_ffffffffffffefd0;
  undefined1 local_1018 [4108];
  uint local_c;
  
  local_c = in_ESI;
  pcVar2 = portable_realpath(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  sVar3 = strlen(pcVar2);
  iVar1 = (int)sVar3 + 9;
  if (0xfff < iVar1) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/gba_system.c",0x35)
    ;
    fprintf(_stderr,
            "Savestate path too long! How deeply are you nesting your directories?\n\x1b[0;m");
    exit(1);
  }
  pcVar2 = (char *)malloc((long)iVar1);
  snprintf(pcVar2,(long)iVar1,"%s.%02d.save",local_1018,(ulong)local_c);
  return pcVar2;
}

Assistant:

const char* get_savestate_path(const char* romfile, int number) {
    char buf[PATH_MAX];
    char* rom_path = portable_realpath(romfile, buf);
    int savestate_path_buf_size = strlen(rom_path) + 9; // .xx.save + null terminator

    if (savestate_path_buf_size >= PATH_MAX) {
        logfatal("Savestate path too long! How deeply are you nesting your directories?")
    }

    char* savestate_path = malloc(savestate_path_buf_size);
    snprintf(savestate_path, savestate_path_buf_size, "%s.%02d.save", buf, number);
    return savestate_path;
}